

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O3

void __thiscall
vkt::image::Buffer::Buffer
          (Buffer *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkBufferCreateInfo *bufferCreateInfo,MemoryRequirement memoryRequirement)

{
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar1;
  VkBuffer obj;
  Handle<(vk::HandleType)8> HVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  VkResult result;
  Handle<(vk::HandleType)8> HVar6;
  Move<vk::Handle<(vk::HandleType)8>_> local_78;
  undefined1 local_58 [24];
  VkAllocationCallbacks *pVStack_40;
  
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  pMVar1 = &this->m_buffer;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::createBuffer(&local_78,vk,device,bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar5 = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar4 = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar3 = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_58._16_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_40 = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_58._0_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_58._8_8_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = pVVar4;
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVVar5;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         HVar6.m_internal;
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj);
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)local_58._16_8_;
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         pVStack_40;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
         local_58._0_8_;
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_58._8_8_;
    if (local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_58,vk,device,
             (VkBuffer)
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
  (*allocator->_vptr_Allocator[3])(&local_78,allocator,local_58,(ulong)memoryRequirement.m_flags);
  HVar2.m_internal = local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  HVar6.m_internal =
       (deUint64)
       (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr;
  if (HVar6.m_internal != HVar2.m_internal) {
    if ((Allocation *)HVar6.m_internal == (Allocation *)0x0) {
      (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)HVar2.m_internal;
      HVar6.m_internal = HVar2.m_internal;
    }
    else {
      (*((Allocation *)HVar6.m_internal)->_vptr_Allocation[1])();
      (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)HVar2.m_internal;
      HVar6.m_internal = HVar2.m_internal;
      if ((long *)local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
          (long *)0x0) {
        (**(code **)(*(long *)local_78.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                              m_internal + 8))();
        HVar6.m_internal =
             (deUint64)
             (this->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      }
    }
  }
  result = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
                      m_internal,(((Allocation *)HVar6.m_internal)->m_memory).m_internal,
                      ((Allocation *)HVar6.m_internal)->m_offset);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageTestsUtil.cpp"
                    ,0x2c);
  return;
}

Assistant:

Buffer::Buffer (const DeviceInterface&		vk,
				const VkDevice				device,
				Allocator&					allocator,
				const VkBufferCreateInfo&	bufferCreateInfo,
				const MemoryRequirement		memoryRequirement)
{
	m_buffer = createBuffer(vk, device, &bufferCreateInfo);
	m_allocation = allocator.allocate(getBufferMemoryRequirements(vk, device, *m_buffer), memoryRequirement);
	VK_CHECK(vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset()));
}